

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::Bullet(void)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImVec2 pos;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImU32 col;
  float fVar5;
  float fVar6;
  ImRect bb;
  ImRect local_38;
  undefined1 local_28 [16];
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    fVar5 = (pIVar2->DC).CurrLineSize.y;
    fVar1 = pIVar3->FontSize;
    fVar6 = (pIVar3->Style).FramePadding.y;
    fVar6 = fVar6 + fVar6 + fVar1;
    if (fVar6 <= fVar5) {
      fVar5 = fVar6;
    }
    fVar5 = (float)(~-(uint)(fVar1 <= fVar5) & (uint)fVar1 | (uint)fVar5 & -(uint)(fVar1 <= fVar5));
    local_28 = ZEXT416((uint)fVar5);
    local_38.Min = (pIVar2->DC).CursorPos;
    local_38.Max.y = (pIVar2->DC).CursorPos.y + fVar5;
    local_38.Max.x = fVar1 + (pIVar2->DC).CursorPos.x;
    ItemSize(&local_38,-1.0);
    bVar4 = ItemAdd(&local_38,0,(ImRect *)0x0);
    if (bVar4) {
      col = GetColorU32(0,1.0);
      pos.y = (float)local_28._0_4_ * 0.5 + local_38.Min.y;
      pos.x = pIVar3->FontSize * 0.5 + (pIVar3->Style).FramePadding.x + local_38.Min.x;
      RenderBullet(pIVar2->DrawList,pos,col);
    }
    fVar5 = (pIVar3->Style).FramePadding.x;
    SameLine(0.0,fVar5 + fVar5);
  }
  return;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}